

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

uint crnlib::rg_etc1::pack_etc2_alpha
               (void *pBlock,uint *pSrc_pixels_rgba,etc2a_pack_params *pack_params)

{
  uint uVar1;
  sbyte sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int i;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined4 *puVar14;
  uint i_1;
  ulong uVar15;
  ulong uVar16;
  uint local_524;
  uint8 data [8];
  uint8 values [8];
  results results;
  uint8 selectors [16];
  params local_4b0;
  dxt5_endpoint_optimizer dxt5_optimizer;
  
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&dxt5_optimizer);
  results.m_pSelectors = selectors;
  local_4b0.m_block_index = 0;
  local_4b0.m_num_pixels = 0x10;
  local_4b0.m_comp_index = pack_params->comp_index;
  local_4b0.m_quality = cCRNDXTQualityUber;
  if (pack_params->m_quality != cHighQuality) {
    local_4b0.m_quality = (pack_params->m_quality == cMediumQuality) + cCRNDXTQualityFast;
  }
  local_4b0.m_use_both_block_types = false;
  local_4b0.m_pPixels = (color_quad_u8 *)pSrc_pixels_rgba;
  dxt5_endpoint_optimizer::compute(&dxt5_optimizer,&local_4b0,&results);
  uVar8 = (uint)results.m_first_endpoint + (uint)results.m_second_endpoint + 1 >> 1;
  puVar14 = &g_etc2a_modifier_table;
  local_524 = 0xffffffff;
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
    iVar3 = *(int *)(&DAT_0018f37c + lVar12 * 0x20);
    iVar3 = (int)((iVar3 >> 1) +
                 ((uint)results.m_first_endpoint - (uint)results.m_second_endpoint) + iVar3) /
            (iVar3 * 2);
    if (0xe < iVar3) {
      iVar3 = 0xf;
    }
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    data[0] = (uint8)uVar8;
    data[1] = (byte)lVar12 | (byte)(iVar3 << 4);
    data[6] = '\0';
    data[7] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      iVar9 = puVar14[lVar6] * iVar3 + (uVar8 & 0xff);
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      values[lVar6] = (uint8)iVar9;
    }
    uVar10 = 0;
    uVar16 = 3;
    uVar11 = 0;
    for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
      uVar1 = uVar11 + 4;
      iVar9 = (int)uVar16;
      for (; uVar11 != uVar1; uVar11 = uVar11 + 1) {
        uVar15 = 0;
        uVar13 = 0xffffffff;
        for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
          uVar4 = (uint)*(byte *)((long)pSrc_pixels_rgba + (ulong)uVar11 * 4 + 3) -
                  (uint)values[uVar7];
          uVar5 = -uVar4;
          if (0 < (int)uVar4) {
            uVar5 = uVar4;
          }
          if (uVar5 < uVar13) {
            uVar15 = uVar7 & 0xffffffff;
            uVar13 = uVar5;
          }
        }
        uVar5 = (uint)uVar16 & 7;
        sVar2 = (sbyte)uVar5;
        data[(uVar16 >> 3) + 2] =
             data[(uVar16 >> 3) + 2] | (byte)((uint)uVar15 << (8U - sVar2 & 0x1f));
        if (uVar5 < 3) {
          data[(uVar16 >> 3) + 1] = data[(uVar16 >> 3) + 1] | (byte)((uint)uVar15 >> sVar2);
        }
        uVar10 = uVar10 + uVar13 * uVar13;
        uVar16 = (ulong)((uint)uVar16 + 0xc);
      }
      uVar16 = (ulong)(iVar9 + 3);
      uVar11 = uVar1;
    }
    if (uVar10 < local_524) {
      *(ulong *)pBlock = CONCAT26(data._6_2_,CONCAT42(data._2_4_,CONCAT11(data[1],data[0])));
      local_524 = uVar10;
    }
    puVar14 = puVar14 + 8;
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&dxt5_optimizer);
  return local_524;
}

Assistant:

unsigned int pack_etc2_alpha(void* pBlock, const unsigned int* pSrc_pixels_rgba, etc2a_pack_params& pack_params)
        {
            crnlib::color_quad_u8* pixels = (crnlib::color_quad_u8*)pSrc_pixels_rgba;
            dxt5_endpoint_optimizer dxt5_optimizer;

            dxt5_endpoint_optimizer::results results;
            uint8 selectors[16];
            results.m_pSelectors = selectors;

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = pixels;
            params.m_num_pixels = 16;
            params.m_comp_index = pack_params.comp_index;
            params.m_quality = pack_params.m_quality == cHighQuality ? cCRNDXTQualityUber : pack_params.m_quality == cMediumQuality ? cCRNDXTQualityNormal
                                                                                                                                    : cCRNDXTQualityFast;
            params.m_use_both_block_types = false;
            dxt5_optimizer.compute(params, results);

            uint base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
            uint best_error = cUINT32_MAX;
            for (int modifier_index = 0; modifier_index < 16; modifier_index++)
            {
                const int* modifier = g_etc2a_modifier_table[modifier_index];
                int multiplier = math::clamp<int>((results.m_first_endpoint - results.m_second_endpoint + modifier[7] + (modifier[7] >> 1)) / (modifier[7] << 1), 1, 15);
                uint8 data[8] = { (uint8)base_codeword, (uint8)(multiplier << 4 | modifier_index) }, values[8];
                for (int i = 0; i < 8; i++)
                {
                    values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                uint error = 0;
                for (uint d0 = 3, t = 0, i = 0; i < 4; i++, d0 += 3)
                {
                    for (uint d = d0, j = 0; j < 4; j++, t++, d += 12)
                    {
                        int a = pixels[t].a;
                        uint byte_offset = 2 + (d >> 3);
                        uint bit_offset = d & 7;
                        uint best_s = 0;
                        uint best_delta = cUINT32_MAX;
                        for (uint s = 0; s < 8; s++)
                        {
                            uint delta = abs(a - values[s]);
                            if (delta < best_delta)
                            {
                                best_s = s;
                                best_delta = delta;
                            }
                        }
                        error += best_delta * best_delta;
                        data[byte_offset] |= best_s << (8 - bit_offset);
                        if (bit_offset < 3)
                        {
                            data[byte_offset - 1] |= best_s >> bit_offset;
                        }
                    }
                }
                if (error < best_error)
                {
                    memcpy(pBlock, data, 8);
                    best_error = error;
                }
            }

            return best_error;
        }